

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O3

bool __thiscall
cmQtAutoGenerator::Run
          (cmQtAutoGenerator *this,string_view infoFile,string_view config,
          string_view executableConfig)

{
  string *in_path;
  pointer pcVar1;
  GenT GVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  string_view text;
  string_view message;
  string_view text_00;
  string_view text_01;
  string_view message_00;
  InfoT info;
  ifstream ifs;
  uint local_31c;
  string local_318;
  string local_2f8;
  ValueHolder local_2d8;
  undefined8 local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  cmQtAutoGenerator *local_2b0;
  string local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_288;
  string *local_280;
  string local_278;
  string local_258;
  undefined1 local_238 [32];
  ValueHolder local_218;
  ValueHolder *local_210;
  undefined8 local_208;
  char *local_200;
  undefined8 local_1f8;
  
  pcVar6 = (char *)config._M_len;
  pcVar1 = local_238 + 0x10;
  local_238._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_238,config._M_str,pcVar6 + (long)config._M_str);
  std::__cxx11::string::operator=((string *)&this->InfoConfig_,(string *)local_238);
  if ((pointer)local_238._0_8_ != pcVar1) {
    operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
  }
  local_238._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_238,executableConfig._M_str,
             executableConfig._M_str + executableConfig._M_len);
  std::__cxx11::string::operator=((string *)&this->ExecutableConfig_,(string *)local_238);
  if ((pointer)local_238._0_8_ != pcVar1) {
    operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
  }
  local_238._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_238,infoFile._M_str,infoFile._M_str + infoFile._M_len);
  in_path = &this->InfoFile_;
  std::__cxx11::string::operator=((string *)in_path,(string *)local_238);
  if ((pointer)local_238._0_8_ != pcVar1) {
    operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
  }
  cmsys::SystemTools::CollapseFullPath(&local_258,in_path);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  cmsys::SystemTools::GetFilenamePath((string *)local_238,in_path);
  std::__cxx11::string::operator=((string *)&this->InfoDir_,(string *)local_238);
  if ((pointer)local_238._0_8_ != pcVar1) {
    operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
  }
  bVar3 = cmFileTime::Load(&this->InfoFileTime_,in_path);
  if (!bVar3) {
    text_00._M_str = pcVar6;
    text_00._M_len = (size_t)(this->InfoFile_)._M_dataplus._M_p;
    cmQtAutoGen::Quoted_abi_cxx11_
              ((string *)&local_2d8,(cmQtAutoGen *)(this->InfoFile_)._M_string_length,text_00);
    local_238._0_8_ = (pointer)0x17;
    local_238._8_8_ = "AutoGen: The info file ";
    local_238._16_8_ = 0;
    local_238._24_8_ = local_2d0;
    local_218.int_ = local_2d8.int_;
    local_208 = 0x11;
    local_200 = " is not readable\n";
    local_1f8 = 0;
    views_00._M_len = 3;
    views_00._M_array = (iterator)local_238;
    local_210 = &local_2d8;
    cmCatViews(&local_2a8,views_00);
    cmSystemTools::Stderr(&local_2a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    if (local_2d8 == &local_2c8) {
      return false;
    }
    operator_delete(local_2d8.string_,local_2c8._M_allocated_capacity + 1);
    return false;
  }
  Json::Value::Value((Value *)&local_2d8,nullValue);
  local_2b0 = this;
  std::ifstream::ifstream(local_238,(this->InfoFile_)._M_dataplus._M_p,_S_in|_S_bin);
  if ((*(byte *)((long)&local_218 + *(long *)(local_238._0_8_ + -0x18)) & 5) == 0) {
    bVar3 = InfoT::Read((InfoT *)&local_2d8,(istream *)local_238);
    if (bVar3) {
      std::ifstream::~ifstream(local_238);
      local_31c = 0;
      local_238._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"VERBOSITY","");
      bVar4 = InfoT::GetUInt((InfoT *)&local_2d8,(string *)local_238,&local_31c,false);
      bVar3 = true;
      if (bVar4) {
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"CMAKE_SOURCE_DIR","");
        bVar4 = InfoT::GetString((InfoT *)&local_2d8,&local_2a8,&(this->ProjectDirs_).Source,true);
        bVar3 = true;
        if (bVar4) {
          local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2f8,"CMAKE_BINARY_DIR","");
          bVar4 = InfoT::GetString((InfoT *)&local_2d8,&local_2f8,&(this->ProjectDirs_).Binary,true)
          ;
          bVar3 = true;
          if (bVar4) {
            local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_318,"CMAKE_CURRENT_SOURCE_DIR","");
            bVar4 = InfoT::GetString((InfoT *)&local_2d8,&local_318,
                                     &(this->ProjectDirs_).CurrentSource,true);
            bVar3 = true;
            if (bVar4) {
              local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_278,"CMAKE_CURRENT_BINARY_DIR","");
              bVar3 = InfoT::GetString((InfoT *)&local_2d8,&local_278,
                                       &(this->ProjectDirs_).CurrentBinary,true);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_278._M_dataplus._M_p != &local_278.field_2) {
                operator_delete(local_278._M_dataplus._M_p,
                                local_278.field_2._M_allocated_capacity + 1);
              }
              bVar3 = !bVar3;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_318._M_dataplus._M_p != &local_318.field_2) {
              operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
            operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
        }
      }
      if ((pointer)local_238._0_8_ != pcVar1) {
        operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
      }
      if (!bVar3) {
        if ((this->Logger_).Verbosity_ < local_31c) {
          (this->Logger_).Verbosity_ = local_31c;
        }
        iVar5 = (*this->_vptr_cmQtAutoGenerator[2])(this,&local_2d8);
        if ((char)iVar5 != '\0') {
          Json::Value::~Value((Value *)&local_2d8);
          iVar5 = (*this->_vptr_cmQtAutoGenerator[3])(this);
          return (bool)(char)iVar5;
        }
      }
      goto LAB_005523b8;
    }
    GVar2 = this->GenType_;
    text_01._M_str = pcVar6;
    text_01._M_len = (size_t)(this->InfoFile_)._M_dataplus._M_p;
    cmQtAutoGen::Quoted_abi_cxx11_
              (&local_318,(cmQtAutoGen *)(this->InfoFile_)._M_string_length,text_01);
    local_2a8._M_dataplus._M_p = &DAT_00000019;
    local_2a8._M_string_length = 0x824cb0;
    local_2a8.field_2._M_allocated_capacity = 0;
    local_2a8.field_2._8_8_ = local_318._M_string_length;
    local_288 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_318._M_dataplus._M_p;
    views_01._M_len = 2;
    views_01._M_array = (iterator)&local_2a8;
    local_280 = &local_318;
    cmCatViews(&local_2f8,views_01);
    message_00._M_str = local_2f8._M_dataplus._M_p;
    message_00._M_len = local_2f8._M_string_length;
    Logger::Error(&this->Logger_,GVar2,message_00);
  }
  else {
    GVar2 = this->GenType_;
    text._M_str = pcVar6;
    text._M_len = (size_t)(this->InfoFile_)._M_dataplus._M_p;
    cmQtAutoGen::Quoted_abi_cxx11_
              (&local_318,(cmQtAutoGen *)(this->InfoFile_)._M_string_length,text);
    local_2a8._M_dataplus._M_p = &DAT_0000001c;
    local_2a8._M_string_length = 0x824c93;
    local_2a8.field_2._M_allocated_capacity = 0;
    local_2a8.field_2._8_8_ = local_318._M_string_length;
    local_288 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_318._M_dataplus._M_p;
    views._M_len = 2;
    views._M_array = (iterator)&local_2a8;
    local_280 = &local_318;
    cmCatViews(&local_2f8,views);
    message._M_str = local_2f8._M_dataplus._M_p;
    message._M_len = local_2f8._M_string_length;
    Logger::Error(&this->Logger_,GVar2,message);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  std::ifstream::~ifstream(local_238);
LAB_005523b8:
  Json::Value::~Value((Value *)&local_2d8);
  return false;
}

Assistant:

bool cmQtAutoGenerator::Run(cm::string_view infoFile, cm::string_view config,
                            cm::string_view executableConfig)
{
  // Info config
  this->InfoConfig_ = std::string(config);
  this->ExecutableConfig_ = std::string(executableConfig);

  // Info file
  this->InfoFile_ = std::string(infoFile);
  cmSystemTools::CollapseFullPath(this->InfoFile_);
  this->InfoDir_ = cmSystemTools::GetFilenamePath(this->InfoFile_);

  // Load info file time
  if (!this->InfoFileTime_.Load(this->InfoFile_)) {
    cmSystemTools::Stderr(cmStrCat("AutoGen: The info file ",
                                   Quoted(this->InfoFile_),
                                   " is not readable\n"));
    return false;
  }

  {
    InfoT info(*this);

    // Read info file
    {
      cmsys::ifstream ifs(this->InfoFile_.c_str(),
                          (std::ios::in | std::ios::binary));
      if (!ifs) {
        this->Log().Error(
          this->GenType_,
          cmStrCat("Could not to open info file ", Quoted(this->InfoFile_)));
        return false;
      }
      if (!info.Read(ifs)) {
        this->Log().Error(
          this->GenType_,
          cmStrCat("Could not read info file ", Quoted(this->InfoFile_)));
        return false;
      }
    }

    // -- Read common info settings
    {
      unsigned int verbosity = 0;
      // Info: setup project directories
      if (!info.GetUInt("VERBOSITY", verbosity, false) ||
          !info.GetString("CMAKE_SOURCE_DIR", this->ProjectDirs_.Source,
                          true) ||
          !info.GetString("CMAKE_BINARY_DIR", this->ProjectDirs_.Binary,
                          true) ||
          !info.GetString("CMAKE_CURRENT_SOURCE_DIR",
                          this->ProjectDirs_.CurrentSource, true) ||
          !info.GetString("CMAKE_CURRENT_BINARY_DIR",
                          this->ProjectDirs_.CurrentBinary, true)) {
        return false;
      }
      this->Logger_.RaiseVerbosity(verbosity);
    }

    // -- Call virtual init from info method.
    if (!this->InitFromInfo(info)) {
      return false;
    }
  }

  // Call virtual process method.
  return this->Process();
}